

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.c
# Opt level: O0

void elf_addrelocnode(RelocList *rl,uint64_t offset,uint64_t addend,uint32_t symidx,uint32_t type,
                     bool be)

{
  node *n;
  node *pnVar1;
  undefined4 in_ECX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  list *in_RDI;
  undefined4 in_R8D;
  undefined4 in_R9D;
  void *elfrel;
  RelocNode *rn;
  size_t in_stack_ffffffffffffffd0;
  
  n = (node *)alloc(in_stack_ffffffffffffffd0);
  pnVar1 = (node *)alloc((size_t)n);
  (*(code *)in_RDI[1].last)(pnVar1,in_RSI,in_RDX,in_ECX,in_R8D,in_R9D);
  n[1].next = pnVar1;
  addtail(in_RDI,n);
  return;
}

Assistant:

void elf_addrelocnode(struct RelocList *rl,uint64_t offset,uint64_t addend,
                      uint32_t symidx,uint32_t type,bool be)
{
  struct RelocNode *rn = alloc(sizeof(struct RelocNode));
  void *elfrel = alloc(rl->relasize);

  rl->initreloc(elfrel,offset,addend,symidx,type,be);
  rn->elfreloc = elfrel;
  addtail(&rl->l,&rn->n);
}